

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdconntable.c
# Opt level: O0

char * SearchStdResConnTable(char *key)

{
  bool bVar1;
  int iVar2;
  char *local_38;
  char *local_30;
  StdResConnTableEntry_t *local_20;
  StdResConnTableEntry_t *t;
  int r;
  char *key_local;
  
  t._4_4_ = 0;
  iVar2 = HashInStdResTbl(key);
  local_20 = StdResTblBucket[iVar2];
  while( true ) {
    bVar1 = false;
    if (local_20 != (StdResConnTableEntry_t *)0x0) {
      t._4_4_ = strcmp(key,local_20->key);
      bVar1 = 0 < t._4_4_;
    }
    if (!bVar1) break;
    local_20 = local_20->next;
  }
  if (local_20 == (StdResConnTableEntry_t *)0x0) {
    local_38 = (char *)0x0;
  }
  else {
    if (t._4_4_ == 0) {
      local_30 = local_20->value;
    }
    else {
      local_30 = (char *)0x0;
    }
    local_38 = local_30;
  }
  return local_38;
}

Assistant:

char *SearchStdResConnTable(char *key) {
   int r = 0;
   StdResConnTableEntry_t *t;

   t = StdResTblBucket[HashInStdResTbl(key)];

   while (t && (r = strcmp(key, t->key)) > 0) {
      t = t->next;
   }

   return (t ? (r ? NULL : t->value) : NULL);
}